

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

double __thiscall
imrt::ApertureILS::iLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  double dVar4;
  _Base_ptr p_Var5;
  char cVar6;
  Station *this_00;
  ostream *poVar7;
  _Base_ptr *pp_Var8;
  clock_t cVar9;
  undefined7 in_register_00000011;
  _List_node_base *p_Var10;
  _List_node_base *__node;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  pointer pdVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  bool bVar18;
  uint uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  undefined1 local_108 [16];
  _Base_ptr local_f8;
  _Rb_tree_node_base *local_f0;
  _Rb_tree_node_base local_e8;
  uint local_c4;
  pointer local_c0;
  pointer local_b8;
  undefined4 local_ac;
  pointer local_a8;
  ApertureILS *local_a0;
  pair<int,_int> local_98;
  int local_90;
  int local_8c;
  int local_88;
  _Rb_tree_color local_84;
  _List_node_base *local_80;
  size_t local_78;
  pointer local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  Collimator *local_58;
  pointer local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_48;
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,verbose);
  local_80 = (_List_node_base *)max_time;
  this_00 = (Station *)Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (&local_48,(list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)this_00);
  local_f8 = (_Base_ptr)0x0;
  local_88 = this->ls_type;
  local_108._0_8_ = (_Rb_tree_node_base *)local_108;
  local_108._8_8_ = (_Rb_tree_node_base *)local_108;
  local_a0 = this;
  local_98 = (pair<int,_int>)P;
  local_c0 = (pointer)Plan::getEvaluation(P);
  if ((char)local_ac != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Staring intensity local search...",0x21);
    cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    this_00 = (Station *)(ulong)(uint)(int)cVar6;
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  local_78 = clock();
  local_58 = (Collimator *)((long)local_98 + 0x80);
  local_60 = (vector<double,_std::allocator<double>_> *)((long)local_98 + 0x98);
  local_68 = (vector<double,_std::allocator<double>_> *)((long)local_98 + 0xb0);
  local_90 = -1;
  p_Var10 = (_List_node_base *)0x0;
  local_8c = -1;
  local_84 = ~_S_red;
  iVar17 = -1;
  p_Var12 = (_Rb_tree_node_base *)0x0;
  do {
    getShuffledIntensityNeighbors
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_e8,
               (ApertureILS *)this_00,(Plan *)local_98);
    p_Var5 = local_e8._M_parent;
    local_f0 = (_Rb_tree_node_base *)local_e8._0_8_;
    local_e8._0_8_ = (_Rb_tree_node_base *)0x0;
    local_e8._M_parent = (_Rb_tree_node_base *)0x0;
    local_e8._M_left = (_Base_ptr)0x0;
    if ((p_Var12 != (_Rb_tree_node_base *)0x0) &&
       (operator_delete(p_Var12), (_Rb_tree_node_base *)local_e8._0_8_ != (_Rb_tree_node_base *)0x0)
       ) {
      operator_delete((void *)local_e8._0_8_);
    }
    local_8c = local_8c + 1;
    p_Var12 = local_f0;
    if ((char)local_ac != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  iLS Neighborhood ",0x13);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_8c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," size ",6);
      p_Var12 = local_f0;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    current ",0xc);
      poVar7 = std::ostream::_M_insert<double>((double)local_c0);
      cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      this_00 = (Station *)(ulong)(uint)(int)cVar6;
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    lVar13 = (long)p_Var5 - (long)p_Var12 >> 3;
    if (p_Var5 == local_f0) {
      bVar18 = false;
      uVar19 = 0;
      uVar20 = SUB84(local_c0,0);
      uVar21 = (undefined4)((ulong)local_c0 >> 0x20);
LAB_0012b643:
      local_a8 = (pointer)CONCAT44(uVar21,uVar20);
    }
    else {
      local_70 = (pointer)(lVar13 + -1);
      local_50 = (pointer)(lVar13 + (ulong)(lVar13 == 0));
      pdVar14 = (pointer)0x0;
      bVar18 = false;
      local_c4 = 0;
      local_a8 = local_c0;
      do {
        _Var1 = (&local_f0->_M_color)[(long)pdVar14 * 2];
        lVar13 = (long)(int)_Var1;
        if ((_Var1 == local_84) && (*(int *)(&local_f0->field_0x4 + (long)pdVar14 * 8) == iVar17)) {
          bVar18 = (bool)(local_70 == pdVar14 | bVar18);
        }
        else {
          p_Var10 = local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
          if ((int)_Var1 < 1) {
            if (_Var1 != _S_red) {
              do {
                p_Var10 = p_Var10->_M_prev;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0);
            }
          }
          else {
            do {
              p_Var10 = p_Var10->_M_next;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
          }
          iVar11 = (int)pdVar14;
          if ((char)local_ac != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  iLS Neighbor ",0xf);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," over station ",0xe);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,*(int *)&(p_Var10[1]._M_next)->_M_prev);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," aperture ",10);
            iVar2 = *(int *)(&local_f0->field_0x4 + (long)pdVar14 * 8);
            iVar15 = -iVar2;
            if (0 < iVar2) {
              iVar15 = iVar2;
            }
            std::ostream::operator<<((ostream *)poVar7,iVar15 + -1);
          }
          uVar19 = *(uint *)(&local_f0->field_0x4 + (long)pdVar14 * 8);
          if ((int)uVar19 < 0) {
            Station::getModifyIntensityApertureDiff_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_e8,(Station *)p_Var10[1]._M_next,~uVar19,
                       (double)-local_a0->step_intensity);
            p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
            if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
              do {
                p_Var3 = *(_Rb_tree_node_base **)p_Var12;
                operator_delete(p_Var12);
                p_Var12 = p_Var3;
              } while (p_Var3 != (_Rb_tree_node_base *)local_108);
            }
            local_f8 = (_Base_ptr)0x0;
            if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
              pp_Var8 = &local_f8;
              local_108._0_8_ = (_Rb_tree_node_base *)local_108;
              local_108._8_8_ = (_Rb_tree_node_base *)local_108;
            }
            else {
              local_108._0_8_ = local_e8._0_8_;
              local_108._8_8_ = local_e8._M_parent;
              *(undefined1 **)local_e8._M_parent = local_108;
              *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
              local_f8 = local_e8._M_left;
              pp_Var8 = &local_e8._M_left;
            }
            *pp_Var8 = (_Base_ptr)0x0;
            this_00 = (Station *)local_108;
            dVar4 = EvaluationFunction::get_delta_eval
                              (*(EvaluationFunction **)((long)local_98 + 0x78),
                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)local_108,(double)*(int *)&(p_Var10[1]._M_next)->_M_prev,
                               (vector<double,_std::allocator<double>_> *)local_58,local_60,local_68
                               ,999999);
            if (dVar4 <= (double)local_c0) {
              this_00 = (Station *)p_Var10[1]._M_next;
              iVar2 = *(int *)(&local_f0->field_0x4 + (long)pdVar14 * 8);
              iVar15 = -iVar2;
              if (0 < iVar2) {
                iVar15 = iVar2;
              }
              Station::modifyIntensityAperture_abi_cxx11_
                        ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_e8,this_00,iVar15 + -1,(double)-local_a0->step_intensity);
              p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
              if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
                do {
                  p_Var3 = *(_Rb_tree_node_base **)p_Var12;
                  operator_delete(p_Var12);
                  p_Var12 = p_Var3;
                } while (p_Var3 != (_Rb_tree_node_base *)local_108);
              }
              local_f8 = (_Base_ptr)0x0;
              if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
                pp_Var8 = &local_f8;
                local_108._0_8_ = (_Rb_tree_node_base *)local_108;
                local_108._8_8_ = (_Rb_tree_node_base *)local_108;
              }
              else {
                local_108._0_8_ = local_e8._0_8_;
                local_108._8_8_ = local_e8._M_parent;
                *(undefined1 **)local_e8._M_parent = local_108;
                *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
                local_f8 = local_e8._M_left;
                pp_Var8 = &local_e8._M_left;
              }
              *pp_Var8 = (_Base_ptr)0x0;
              local_b8 = local_c0;
              if (local_f8 != (_Base_ptr)0x0) {
                this_00 = (Station *)p_Var10[1]._M_next;
                local_b8 = (pointer)Plan::incremental_eval
                                              ((Plan *)local_98,this_00,
                                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                *)local_108);
              }
            }
            else {
              Station::clearHistory((Station *)p_Var10[1]._M_next);
              local_b8 = local_c0;
            }
            if ((char)local_ac == '\0') goto LAB_0012b46d;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (-",3);
            poVar7 = (ostream *)
                     std::ostream::operator<<((ostream *)&std::cout,local_a0->step_intensity);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
LAB_0012b3a9:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result ",8);
            poVar7 = std::ostream::_M_insert<double>((double)local_b8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if (1e-05 < (double)local_a8 - (double)local_b8) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"     improvement ",0x11);
              poVar7 = std::ostream::_M_insert<double>((double)local_b8);
              cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7)
              ;
              this_00 = (Station *)(ulong)(uint)(int)cVar6;
              std::ostream::put((char)poVar7);
              std::ostream::flush();
LAB_0012b483:
              iVar17 = -*(int *)(&local_f0->field_0x4 + (long)pdVar14 * 8);
              local_84 = (&local_f0->_M_color)[(long)pdVar14 * 2];
              local_c4 = (uint)CONCAT71((uint7)(uint3)(local_84 >> 8),1);
              local_90 = iVar11;
              if (local_88 == 0) {
                bVar18 = (bool)(local_70 == pdVar14 | bVar18);
                uVar19 = 1;
                uVar20 = SUB84(local_b8,0);
                uVar21 = (undefined4)((ulong)local_b8 >> 0x20);
                goto LAB_0012b643;
              }
              local_a8 = local_b8;
            }
          }
          else {
            Station::getModifyIntensityApertureDiff_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_e8,(Station *)p_Var10[1]._M_next,uVar19 - 1,
                       (double)local_a0->step_intensity);
            p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
            if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
              do {
                p_Var3 = *(_Rb_tree_node_base **)p_Var12;
                operator_delete(p_Var12);
                p_Var12 = p_Var3;
              } while (p_Var3 != (_Rb_tree_node_base *)local_108);
            }
            local_f8 = (_Base_ptr)0x0;
            if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
              pp_Var8 = &local_f8;
              local_108._0_8_ = (_Rb_tree_node_base *)local_108;
              local_108._8_8_ = (_Rb_tree_node_base *)local_108;
            }
            else {
              local_108._0_8_ = local_e8._0_8_;
              local_108._8_8_ = local_e8._M_parent;
              *(undefined1 **)local_e8._M_parent = local_108;
              *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
              local_f8 = local_e8._M_left;
              pp_Var8 = &local_e8._M_left;
            }
            *pp_Var8 = (_Base_ptr)0x0;
            this_00 = (Station *)local_108;
            dVar4 = EvaluationFunction::get_delta_eval
                              (*(EvaluationFunction **)((long)local_98 + 0x78),
                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)local_108,(double)*(int *)&(p_Var10[1]._M_next)->_M_prev,
                               (vector<double,_std::allocator<double>_> *)local_58,local_60,local_68
                               ,999999);
            if (dVar4 <= (double)local_c0) {
              this_00 = (Station *)p_Var10[1]._M_next;
              Station::modifyIntensityAperture_abi_cxx11_
                        ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_e8,this_00,*(int *)(&local_f0->field_0x4 + (long)pdVar14 * 8) + -1,
                         (double)local_a0->step_intensity);
              p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
              if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
                do {
                  p_Var3 = *(_Rb_tree_node_base **)p_Var12;
                  operator_delete(p_Var12);
                  p_Var12 = p_Var3;
                } while (p_Var3 != (_Rb_tree_node_base *)local_108);
              }
              local_f8 = (_Base_ptr)0x0;
              if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
                pp_Var8 = &local_f8;
                local_108._0_8_ = (_Rb_tree_node_base *)local_108;
                local_108._8_8_ = (_Rb_tree_node_base *)local_108;
              }
              else {
                local_108._0_8_ = local_e8._0_8_;
                local_108._8_8_ = local_e8._M_parent;
                *(undefined1 **)local_e8._M_parent = local_108;
                *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
                local_f8 = local_e8._M_left;
                pp_Var8 = &local_e8._M_left;
              }
              *pp_Var8 = (_Base_ptr)0x0;
              local_b8 = local_c0;
              if (local_f8 != (_Base_ptr)0x0) {
                this_00 = (Station *)p_Var10[1]._M_next;
                local_b8 = (pointer)Plan::incremental_eval
                                              ((Plan *)local_98,this_00,
                                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                *)local_108);
              }
            }
            else {
              Station::clearHistory((Station *)p_Var10[1]._M_next);
              local_b8 = local_c0;
            }
            if ((char)local_ac != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (+",3);
              poVar7 = (ostream *)
                       std::ostream::operator<<((ostream *)&std::cout,local_a0->step_intensity);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
              goto LAB_0012b3a9;
            }
LAB_0012b46d:
            if (1e-05 < (double)local_a8 - (double)local_b8) goto LAB_0012b483;
          }
          this_00 = (Station *)p_Var10[1]._M_next;
          Station::undoLast_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_e8,this_00);
          p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
          if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
            do {
              p_Var3 = *(_Rb_tree_node_base **)p_Var12;
              operator_delete(p_Var12);
              p_Var12 = p_Var3;
            } while (p_Var3 != (_Rb_tree_node_base *)local_108);
          }
          local_f8 = (_Base_ptr)0x0;
          if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
            pp_Var8 = &local_f8;
            local_108._0_8_ = (_Rb_tree_node_base *)local_108;
            local_108._8_8_ = (_Rb_tree_node_base *)local_108;
          }
          else {
            local_108._0_8_ = local_e8._0_8_;
            local_108._8_8_ = local_e8._M_parent;
            *(undefined1 **)local_e8._M_parent = local_108;
            *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
            local_f8 = local_e8._M_left;
            pp_Var8 = &local_e8._M_left;
          }
          *pp_Var8 = (_Base_ptr)0x0;
          if (local_f8 != (_Base_ptr)0x0) {
            this_00 = (Station *)p_Var10[1]._M_next;
            Plan::incremental_eval
                      ((Plan *)local_98,this_00,
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       local_108);
          }
          bVar18 = (bool)(local_70 == pdVar14 | bVar18);
          cVar9 = clock();
          if ((((double)local_80 != 0.0) || (NAN((double)local_80))) &&
             ((double)local_80 <= (double)(long)(cVar9 - local_78) / 1000000.0)) break;
        }
        pdVar14 = (pointer)((long)pdVar14 + 1);
      } while (pdVar14 != local_50);
      uVar19 = local_c4;
      if ((local_88 != 0 & (byte)local_c4) == 1) {
        uVar19 = *(uint *)(&local_f0->field_0x4 + (long)local_90 * 8);
        if ((int)uVar19 < 0) {
          Station::modifyIntensityAperture_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_e8,(Station *)p_Var10[1]._M_next,~uVar19,
                     (double)-local_a0->step_intensity);
          p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
          if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
            do {
              p_Var3 = *(_Rb_tree_node_base **)p_Var12;
              operator_delete(p_Var12);
              p_Var12 = p_Var3;
            } while (p_Var3 != (_Rb_tree_node_base *)local_108);
          }
        }
        else {
          Station::modifyIntensityAperture_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_e8,(Station *)p_Var10[1]._M_next,uVar19 - 1,
                     (double)local_a0->step_intensity);
          p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
          if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
            do {
              p_Var3 = *(_Rb_tree_node_base **)p_Var12;
              operator_delete(p_Var12);
              p_Var12 = p_Var3;
            } while (p_Var3 != (_Rb_tree_node_base *)local_108);
          }
        }
        uVar19 = local_c4;
        local_f8 = (_Base_ptr)0x0;
        if ((_Rb_tree_node_base *)local_e8._0_8_ == &local_e8) {
          pp_Var8 = &local_f8;
          local_108._0_8_ = (_Rb_tree_node_base *)local_108;
          local_108._8_8_ = (_Rb_tree_node_base *)local_108;
        }
        else {
          local_108._0_8_ = local_e8._0_8_;
          local_108._8_8_ = local_e8._M_parent;
          *(undefined1 **)local_e8._M_parent = local_108;
          *(_Base_ptr *)(local_e8._0_8_ + 8) = (_Base_ptr)local_108;
          local_f8 = local_e8._M_left;
          pp_Var8 = &local_e8._M_left;
        }
        *pp_Var8 = (_Base_ptr)0x0;
        this_00 = (Station *)p_Var10[1]._M_next;
        Plan::incremental_eval
                  ((Plan *)local_98,this_00,
                   (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   local_108);
      }
    }
    cVar9 = clock();
    p_Var12 = local_f0;
    if ((((double)local_80 != 0.0) || (NAN((double)local_80))) &&
       ((double)local_80 <= (double)(long)(cVar9 - local_78) / 1000000.0)) break;
    local_c0 = local_a8;
  } while ((uVar19 & 1) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  iLS best: ",0xc);
  std::ostream::_M_insert<double>((double)local_a8);
  pcVar16 = ": [nolo] : ";
  if (bVar18) {
    pcVar16 = ": [lo] : ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar16,(ulong)((byte)~bVar18 & 1) * 2 + 9);
  cVar9 = clock();
  poVar7 = std::ostream::_M_insert<double>((double)local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," :",2);
  poVar7 = std::ostream::_M_insert<double>((double)(long)(cVar9 - local_78) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (p_Var12 != (_Rb_tree_node_base *)0x0) {
    operator_delete(p_Var12);
  }
  p_Var12 = (_Rb_tree_node_base *)local_108._0_8_;
  if ((_Rb_tree_node_base *)local_108._0_8_ != (_Rb_tree_node_base *)local_108) {
    do {
      p_Var3 = *(_Rb_tree_node_base **)p_Var12;
      operator_delete(p_Var12);
      p_Var12 = p_Var3;
    } while (p_Var3 != (_Rb_tree_node_base *)local_108);
  }
  while (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var10 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var10;
  }
  return (double)local_a8;
}

Assistant:

double ApertureILS::iLocalSearch (Plan& P,  double max_time, bool verbose) {
    list<Station*> stations = P.get_stations();
    list<Station*>::iterator s;
    
    std::clock_t time_end, time_begin;
    double used_time; 
    
    double local_best_eval, current_eval, aux_eval;
    list<pair<int, double> > diff;
    vector<pair<int, int>> a_list;
    pair <int,int> tabu;
    
    bool improvement = true;
    bool best_improvement=ls_type;
    bool completed = false;
    int i, j, best_n;
    
    tabu = make_pair(-1,-1);
    best_n = -1;
    j=-1;
    local_best_eval = current_eval = aux_eval = P.getEvaluation();
    
    if (verbose)
      cout << "Staring intensity local search..." << endl;
    time_begin=clock();
    
    // Main local search loop
    while (improvement) {
      improvement = false;
      completed = false;
      j++;
      current_eval = local_best_eval;
      a_list = getShuffledIntensityNeighbors(P);

      if (verbose) {
        cout << "  iLS Neighborhood "<< j << " size "<< a_list.size() << "    current " << local_best_eval << endl;
      }
      
      // Check all the neighbors
      for (i = 0; i < a_list.size(); i++) {
         //skip the tabu neighbor (returns the station to previous state)
         if (a_list[i].first == tabu.first && a_list[i].second == tabu.second) {
           if (i == (a_list.size()-1)) completed = true;
           continue;
         }
         //get the station of the movement
         s = stations.begin();
         std::advance(s, a_list[i].first);
         
         if (verbose)
             cout << "  iLS Neighbor " << i << " over station " << (*s)->getAngle() << " aperture " <<  abs(a_list[i].second)-1;
         
         aux_eval = current_eval;
         
         //apply step_size intensity change (-(a+1) or +(a+1))
         if (a_list[i].second < 0 ){
           diff = (*s)->getModifyIntensityApertureDiff(abs(a_list[i].second)-1, -step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(abs(a_list[i].second)-1, -step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (-" << step_intensity << ")";
         } else {
           diff = (*s)->getModifyIntensityApertureDiff(a_list[i].second-1, step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(a_list[i].second-1, step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (+"<< step_intensity << ")";
         }
         
         if (verbose )
             cout << " result " << aux_eval <<endl;
         // First improvement
         if ((local_best_eval - aux_eval) > 0.00001){
           local_best_eval = aux_eval;
           best_n = i;
           improvement = true;
           if (verbose)
             cout << "     improvement " << aux_eval << endl ;
           
           
           // Add a tabu movement since we found improvement
           tabu.first = a_list[i].first;
           tabu.second = -1*a_list[i].second;
           
           // If first improvement has been chosen break and 
           if (!best_improvement) { 
             if (i==(a_list.size()-1)) completed = true;
             break;
           }
         }
         
         // Undo movement to continue the search
         diff = (*s)->undoLast();
         if (diff.size()>0)
           aux_eval = P.incremental_eval(*(*s), diff);
         
         if (i == (a_list.size()-1)) completed = true;
         
         time_end = clock();
         used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
         if (max_time!=0 && used_time >= max_time) {
           break;
         }
       } 
      
       //Apply best neighbor
       if (improvement && best_improvement) {
         if (a_list[best_n].second < 0 ){
           diff = (*s)->modifyIntensityAperture(abs(a_list[best_n].second)-1, -step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         } else {
           diff = (*s)->modifyIntensityAperture(a_list[best_n].second-1, step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         }
       }
       
       time_end = clock();
       used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
       if (max_time!=0 && used_time >= max_time) {
         break;
       }
    }
    
    cout << "  iLS best: " << local_best_eval ;
    if (!completed) cout << ": [nolo] : ";
    else  cout << ": [lo] : ";
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << max_time << " :" << used_time << endl;
    return(local_best_eval);
}